

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

void __thiscall
dynet::NaryTreeLSTMBuilder::new_graph_impl
          (NaryTreeLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  initializer_list<dynet::Expression> __l;
  Expression EVar1;
  Expression EVar2;
  Expression EVar3;
  Expression EVar4;
  Expression EVar5;
  Expression EVar6;
  Expression EVar7;
  Expression EVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  byte in_DL;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RSI;
  long in_RDI;
  uint k;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vals;
  LookupParameter p_1;
  uint p_type;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  lvars;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  Expression i_bc;
  Expression i_x2c;
  Expression i_bo;
  Expression i_x2o;
  Expression i_bf;
  Expression i_x2f;
  Expression i_bi;
  Expression i_x2i;
  value_type *lp;
  value_type *p;
  uint i;
  LookupParameterStorage *in_stack_fffffffffffffd08;
  Parameter in_stack_fffffffffffffd10;
  undefined1 *in_stack_fffffffffffffd18;
  LookupParameterStorage *in_stack_fffffffffffffd20;
  allocator_type *in_stack_fffffffffffffd28;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffd30;
  iterator pEVar13;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffd40;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffd98;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffda0;
  uint local_238;
  undefined1 local_231;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_230;
  LookupParameter local_218;
  uint local_210;
  undefined1 local_209 [48];
  undefined1 local_1d9 [17];
  ComputationGraph *local_1c8;
  undefined8 uStack_1c0;
  ComputationGraph *local_1b8;
  undefined8 uStack_1b0;
  ComputationGraph *local_1a8;
  undefined8 uStack_1a0;
  ComputationGraph *local_198;
  undefined8 uStack_190;
  ComputationGraph *local_188;
  undefined8 uStack_180;
  ComputationGraph *local_178;
  undefined8 uStack_170;
  ComputationGraph *local_168;
  undefined8 uStack_160;
  undefined1 *local_150;
  undefined8 local_148;
  ParameterStorage *local_128;
  ParameterStorage *local_120;
  Expression local_118;
  ParameterStorage *local_108;
  ParameterStorage *local_100;
  Expression local_f8;
  ParameterStorage *local_e8;
  ParameterStorage *local_e0;
  Expression local_d8;
  ParameterStorage *local_c8;
  ParameterStorage *local_c0;
  Expression local_b8;
  ParameterStorage *local_a8;
  ParameterStorage *local_a0;
  Expression local_98;
  ParameterStorage *local_88;
  ParameterStorage *local_80;
  Expression local_78;
  ParameterStorage *local_68;
  ParameterStorage *local_60;
  Expression local_58;
  ParameterStorage *local_48;
  ParameterStorage *local_40;
  Expression local_38;
  reference local_28;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *local_20;
  uint local_18;
  byte local_11;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_10;
  
  local_11 = in_DL & 1;
  *(vector<dynet::Expression,_std::allocator<dynet::Expression>_> **)(in_RDI + 0x1a0) = in_RSI;
  local_10 = in_RSI;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           *)0xdc21bd);
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::clear((vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
           *)0xdc21d1);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::reserve((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::reserve((vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
             *)in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
  for (local_18 = 0; local_18 < *(uint *)(in_RDI + 0x198); local_18 = local_18 + 1) {
    local_20 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                             *)(in_RDI + 0xd0),(ulong)local_18);
    local_28 = std::
               vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
               ::operator[]((vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
                             *)(in_RDI + 0xe8),(ulong)local_18);
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,0);
      local_48 = pvVar9->p;
      local_38 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,0);
      local_40 = pvVar9->p;
      local_38 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      in_stack_fffffffffffffda0 = local_10;
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,1);
      local_68 = pvVar9->p;
      local_58 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,1);
      local_60 = pvVar9->p;
      local_58 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,2);
      local_88 = pvVar9->p;
      local_78 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      in_stack_fffffffffffffd98 = local_10;
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,2);
      local_80 = pvVar9->p;
      local_78 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,3);
      local_a8 = pvVar9->p;
      local_98 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,3);
      local_a0 = pvVar9->p;
      local_98 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,4);
      local_c8 = pvVar9->p;
      local_b8 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,4);
      local_c0 = pvVar9->p;
      local_b8 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,5);
      local_e8 = pvVar9->p;
      local_d8 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,5);
      local_e0 = pvVar9->p;
      local_d8 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,6);
      local_108 = pvVar9->p;
      local_f8 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                 in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,6);
      local_100 = pvVar9->p;
      local_f8 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10);
    }
    if ((local_11 & 1) == 0) {
      in_stack_fffffffffffffd40 = local_10;
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,7);
      local_128 = pvVar9->p;
      local_118 = const_parameter((ComputationGraph *)in_stack_fffffffffffffd08,
                                  in_stack_fffffffffffffd10);
    }
    else {
      pvVar9 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (local_20,7);
      local_120 = pvVar9->p;
      local_118 = parameter((ComputationGraph *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd10)
      ;
    }
    EVar8 = local_38;
    EVar7 = local_58;
    EVar6 = local_78;
    EVar5 = local_98;
    EVar4 = local_b8;
    EVar3 = local_d8;
    EVar2 = local_f8;
    EVar1 = local_118;
    local_1d9._1_8_ = local_38.pg;
    local_1d9._9_4_ = local_38.i;
    local_1d9._13_4_ = local_38.graph_id;
    local_1c8 = local_58.pg;
    uStack_1c0._0_4_ = local_58.i;
    uStack_1c0._4_4_ = local_58.graph_id;
    local_1b8 = local_78.pg;
    uStack_1b0._0_4_ = local_78.i;
    uStack_1b0._4_4_ = local_78.graph_id;
    local_1a8 = local_98.pg;
    uStack_1a0._0_4_ = local_98.i;
    uStack_1a0._4_4_ = local_98.graph_id;
    local_198 = local_b8.pg;
    uStack_190._0_4_ = local_b8.i;
    uStack_190._4_4_ = local_b8.graph_id;
    local_188 = local_d8.pg;
    uStack_180._0_4_ = local_d8.i;
    uStack_180._4_4_ = local_d8.graph_id;
    local_178 = local_f8.pg;
    uStack_170._0_4_ = local_f8.i;
    uStack_170._4_4_ = local_f8.graph_id;
    local_168 = local_118.pg;
    uStack_160._0_4_ = local_118.i;
    uStack_160._4_4_ = local_118.graph_id;
    local_150 = local_1d9 + 1;
    local_148 = 8;
    pEVar13 = (iterator)local_1d9;
    local_118 = EVar1;
    local_f8 = EVar2;
    local_d8 = EVar3;
    local_b8 = EVar4;
    local_98 = EVar5;
    local_78 = EVar6;
    local_58 = EVar7;
    local_38 = EVar8;
    std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc2881);
    __l._M_len = (size_type)in_stack_fffffffffffffd40;
    __l._M_array = pEVar13;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              (in_stack_fffffffffffffd30,__l,in_stack_fffffffffffffd28);
    std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc28b2);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 *)in_stack_fffffffffffffd10.p,(value_type *)in_stack_fffffffffffffd08);
    in_stack_fffffffffffffd28 =
         (allocator_type *)
         std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::size
                   (local_28);
    in_stack_fffffffffffffd30 =
         (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_209;
    std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>::allocator
              ((allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_> *)
               0xdc28f4);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              *)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
             (allocator_type *)in_stack_fffffffffffffd10.p);
    std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>::~allocator
              ((allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_> *)
               0xdc291a);
    for (local_210 = 0; local_210 < 7; local_210 = local_210 + 1) {
      pvVar10 = std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::
                operator[](local_28,(ulong)local_210);
      local_218.p = pvVar10->p;
      in_stack_fffffffffffffd20 = LookupParameter::get_storage(&local_218);
      in_stack_fffffffffffffd10.p =
           (ParameterStorage *)
           std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::size
                     (&in_stack_fffffffffffffd20->values);
      in_stack_fffffffffffffd18 = &local_231;
      std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc2990);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
                 (allocator_type *)in_stack_fffffffffffffd10.p);
      std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc29b6);
      local_238 = 0;
      while( true ) {
        in_stack_fffffffffffffd08 = LookupParameter::get_storage(&local_218);
        sVar11 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::size
                           (&in_stack_fffffffffffffd08->values);
        if (sVar11 <= local_238) break;
        pvVar12 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                            (&local_230,(ulong)local_238);
        pvVar12->i = 0;
        local_238 = local_238 + 1;
      }
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                    *)(local_209 + 1),(ulong)local_210);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator=
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffffd10.p);
    }
    std::
    vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
                 *)in_stack_fffffffffffffd10.p,(value_type *)in_stack_fffffffffffffd08);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::~vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)in_stack_fffffffffffffd10.p);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffffd10.p);
  }
  return;
}

Assistant:

void NaryTreeLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update) {
  this->cg = &cg;
  param_vars.clear();
  lparam_vars.clear();
  param_vars.reserve(layers);
  lparam_vars.reserve(layers);

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];
    auto& lp = lparams[i];

    //i
    Expression i_x2i = update ? parameter(cg, p[X2I]) : const_parameter(cg, p[X2I]);
    Expression i_bi = update ? parameter(cg, p[BI]) : const_parameter(cg, p[BI]);
    //f
    Expression i_x2f = update ? parameter(cg, p[X2F]) : const_parameter(cg, p[X2F]);
    Expression i_bf = update ? parameter(cg, p[BF]) : const_parameter(cg, p[BF]);
    //o
    Expression i_x2o = update ? parameter(cg, p[X2O]) : const_parameter(cg, p[X2O]);
    Expression i_bo = update ? parameter(cg, p[BO]) : const_parameter(cg, p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg, p[X2C]) : const_parameter(cg, p[X2C]);
    Expression i_bc = update ? parameter(cg, p[BC]) : const_parameter(cg, p[BC]);

    vector<Expression> vars = {i_x2i, i_bi, i_x2f, i_bf, i_x2o, i_bo, i_x2c, i_bc};
    param_vars.push_back(vars);

    DYNET_ASSERT(lp.size() == C2O + 1, "Dimension mismatch in TreeLSTM");
    vector<vector<Expression>> lvars(lp.size());
    for (unsigned p_type = H2I; p_type <= C2O; p_type++) {
    LookupParameter p = lp[p_type];
      vector<Expression> vals(p.get_storage().values.size());
      for (unsigned k = 0; k < p.get_storage().values.size(); ++k) {
        //vals[k] = lookup(cg, p, k);
        vals[k].i = 0;
      }
      lvars[p_type] = vals;
    }
    lparam_vars.push_back(lvars);
  }
}